

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_JPEG_Image.cxx
# Opt level: O1

boolean fill_input_buffer(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  JOCTET *pJVar2;
  
  pjVar1 = cinfo->src;
  pJVar2 = (JOCTET *)pjVar1[1].bytes_in_buffer;
  pjVar1->next_input_byte = pJVar2;
  pjVar1->bytes_in_buffer = 0x1000;
  pjVar1[1].bytes_in_buffer = (size_t)(pJVar2 + 0x1000);
  return 1;
}

Assistant:

static boolean fill_input_buffer(j_decompress_ptr cinfo) {
    my_src_ptr src = (my_src_ptr)cinfo->src;
    size_t nbytes = 4096;
    src->pub.next_input_byte = src->s;
    src->pub.bytes_in_buffer = nbytes;
    src->s += nbytes;
    return TRUE;
  }